

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
make_assert_begin_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,syntax_option_type flags,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  assert_bol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  matcher;
  detail local_15;
  assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  local_14;
  
  if (((uint)this >> 10 & 1) == 0) {
    assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::assert_line_base(&local_14,
                       (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                       CONCAT44(in_register_00000014,flags));
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_bol_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
              (__return_storage_ptr__,(detail *)&local_14,
               (assert_bol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                *)CONCAT44(extraout_var,extraout_EDX));
  }
  else {
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_bos_matcher>
              (__return_storage_ptr__,&local_15,
               (assert_bos_matcher *)CONCAT44(in_register_00000014,flags));
  }
  return __return_storage_ptr__;
}

Assistant:

inline sequence<BidiIter> make_assert_begin_line
(
    regex_constants::syntax_option_type flags
  , Traits const &tr
)
{
    if(0 != (regex_constants::single_line & flags))
    {
        return detail::make_dynamic<BidiIter>(detail::assert_bos_matcher());
    }
    else
    {
        detail::assert_bol_matcher<Traits> matcher(tr);
        return detail::make_dynamic<BidiIter>(matcher);
    }
}